

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analysis.cc
# Opt level: O2

void __thiscall kratos::InterfaceVisitor::visit(InterfaceVisitor *this,Generator *generator)

{
  pointer psVar1;
  pointer psVar2;
  InterfaceRef *ref;
  char cVar3;
  _Base_ptr p_Var4;
  long lVar5;
  shared_ptr<kratos::InterfaceInstantiationStmt> sVar6;
  undefined1 local_98 [8];
  set<const_kratos::InterfaceRef_*,_std::less<const_kratos::InterfaceRef_*>,_std::allocator<const_kratos::InterfaceRef_*>_>
  refs;
  shared_ptr<kratos::InterfacePort> interface_p;
  shared_ptr<kratos::IDefinition> def;
  undefined1 local_40 [8];
  shared_ptr<kratos::Port> p;
  
  psVar1 = (generator->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar2 = (generator->stmts_).
           super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  for (lVar5 = 0; (long)psVar1 - (long)psVar2 >> 4 != lVar5; lVar5 = lVar5 + 1) {
    Generator::get_stmt((Generator *)local_98,(uint32_t)generator);
    if (*(int *)((long)local_98 + 0x78) == 6) {
      sVar6 = Stmt::as<kratos::InterfaceInstantiationStmt>((Stmt *)local_40);
      (*(this->super_IRVisitor)._vptr_IRVisitor[0x1f])
                (this,local_40,
                 sVar6.
                 super___shared_ptr<kratos::InterfaceInstantiationStmt,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi._M_pi);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&refs);
  }
  refs._M_t._M_impl._0_4_ = 0;
  refs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  refs._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  refs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)&refs;
  refs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  refs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       refs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  for (p_Var4 = (generator->ports_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(generator->ports_)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    Generator::get_port((Generator *)local_40,(string *)generator);
    cVar3 = (*(code *)((__shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2> *)local_40)->
                      _M_ptr[2].value_str.field_2._M_allocated_capacity)();
    if (cVar3 != '\0') {
      Var::as<kratos::InterfacePort>((Var *)&refs._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ref = *(InterfaceRef **)(refs._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x280);
      std::__shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2> *)
                 &interface_p.super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(__shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2> *)ref);
      update_interface_definition
                ((InterfaceVisitor *)
                 def.super___shared_ptr<kratos::IDefinition,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                 ._M_pi,(shared_ptr<kratos::IDefinition> *)
                        &interface_p.
                         super___shared_ptr<kratos::InterfacePort,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount,ref,generator);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&def);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&interface_p);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p);
  }
  std::
  _Rb_tree<const_kratos::InterfaceRef_*,_const_kratos::InterfaceRef_*,_std::_Identity<const_kratos::InterfaceRef_*>,_std::less<const_kratos::InterfaceRef_*>,_std::allocator<const_kratos::InterfaceRef_*>_>
  ::~_Rb_tree((_Rb_tree<const_kratos::InterfaceRef_*,_const_kratos::InterfaceRef_*,_std::_Identity<const_kratos::InterfaceRef_*>,_std::less<const_kratos::InterfaceRef_*>,_std::allocator<const_kratos::InterfaceRef_*>_>
               *)local_98);
  return;
}

Assistant:

void visit(Generator* generator) override {
        // local variables
        uint64_t stmt_count = generator->stmts_count();
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto stmt = generator->get_stmt(i);
            if (stmt->type() == StatementType::InterfaceInstantiation) {
                visit(stmt->as<InterfaceInstantiationStmt>().get());
            }
        }
        // ports as well
        std::set<const InterfaceRef*> refs;
        for (auto const& port_name : generator->get_port_names()) {
            auto p = generator->get_port(port_name);
            if (p->is_interface()) {
                auto interface_p = p->as<InterfacePort>();
                const auto* ref = interface_p->interface();
                auto def = ref->definition();
                update_interface_definition(def, ref, generator);
            }
        }
    }